

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts3ColumnFilter(int iCol,int bZero,char **ppList,int *pnList)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  byte bVar4;
  byte *pbVar5;
  byte *pbVar6;
  uint uVar7;
  ulong uVar8;
  byte *pbVar9;
  int iCurrent;
  int local_48;
  int local_44;
  char **local_40;
  int *local_38;
  
  pbVar6 = (byte *)*ppList;
  uVar8 = (ulong)*pnList;
  pbVar9 = pbVar6 + uVar8;
  local_48 = 0;
  pbVar5 = pbVar6;
  local_44 = bZero;
  local_40 = ppList;
  local_38 = pnList;
  do {
    if (pbVar5 < pbVar9) {
      bVar4 = 0;
      do {
        bVar1 = *pbVar5;
        if ((bVar1 & 0xfe) == 0 && bVar4 == 0) break;
        pbVar5 = pbVar5 + 1;
        bVar4 = bVar1 & 0x80;
      } while (pbVar5 < pbVar9);
    }
    if (local_48 == iCol) {
      uVar8 = (ulong)(uint)((int)pbVar5 - (int)pbVar6);
LAB_001b66f5:
      bVar2 = false;
    }
    else {
      uVar7 = (int)uVar8 + ((int)pbVar6 - (int)pbVar5);
      uVar8 = (ulong)uVar7;
      pbVar6 = pbVar5;
      if (uVar7 == 0) {
        uVar8 = 0;
        goto LAB_001b66f5;
      }
      if ((char)pbVar5[1] < '\0') {
        uVar7 = sqlite3Fts3GetVarint32((char *)(pbVar5 + 1),&local_48);
        uVar3 = (ulong)uVar7;
      }
      else {
        uVar3 = 1;
        local_48 = (int)(char)pbVar5[1];
      }
      pbVar5 = pbVar5 + 1 + uVar3;
      bVar2 = true;
    }
    if (!bVar2) {
      if ((local_44 != 0) && (pbVar5 = pbVar6 + (int)uVar8, pbVar5 != pbVar9)) {
        memset(pbVar5,0,(long)pbVar9 - (long)pbVar5);
      }
      *local_40 = (char *)pbVar6;
      *local_38 = (int)uVar8;
      return;
    }
  } while( true );
}

Assistant:

static void fts3ColumnFilter(
  int iCol,                       /* Column to filter on */
  int bZero,                      /* Zero out anything following *ppList */
  char **ppList,                  /* IN/OUT: Pointer to position list */
  int *pnList                     /* IN/OUT: Size of buffer *ppList in bytes */
){
  char *pList = *ppList;
  int nList = *pnList;
  char *pEnd = &pList[nList];
  int iCurrent = 0;
  char *p = pList;

  assert( iCol>=0 );
  while( 1 ){
    char c = 0;
    while( p<pEnd && (c | *p)&0xFE ) c = *p++ & 0x80;
  
    if( iCol==iCurrent ){
      nList = (int)(p - pList);
      break;
    }

    nList -= (int)(p - pList);
    pList = p;
    if( nList==0 ){
      break;
    }
    p = &pList[1];
    p += fts3GetVarint32(p, &iCurrent);
  }

  if( bZero && &pList[nList]!=pEnd ){
    memset(&pList[nList], 0, pEnd - &pList[nList]);
  }
  *ppList = pList;
  *pnList = nList;
}